

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall
anon_unknown.dwarf_1bf255::SwiftCompilerTool::createCustomCommand
          (SwiftCompilerTool *this,BuildKey *key)

{
  char *pcVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  BuildKey *in_RDX;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  StringRef SVar6;
  size_type __dnew;
  _func_int *local_30;
  
  SVar6 = llbuild::buildsystem::BuildKey::getCustomTaskName(in_RDX);
  pcVar1 = SVar6.Data;
  if ((SVar6.Length == 0x11) &&
     (auVar4[0] = -(*pcVar1 == 's'), auVar4[1] = -(pcVar1[1] == 'w'),
     auVar4[2] = -(pcVar1[2] == 'i'), auVar4[3] = -(pcVar1[3] == 'f'),
     auVar4[4] = -(pcVar1[4] == 't'), auVar4[5] = -(pcVar1[5] == '-'),
     auVar4[6] = -(pcVar1[6] == 'g'), auVar4[7] = -(pcVar1[7] == 'e'),
     auVar4[8] = -(pcVar1[8] == 't'), auVar4[9] = -(pcVar1[9] == '-'),
     auVar4[10] = -(pcVar1[10] == 'v'), auVar4[0xb] = -(pcVar1[0xb] == 'e'),
     auVar4[0xc] = -(pcVar1[0xc] == 'r'), auVar4[0xd] = -(pcVar1[0xd] == 's'),
     auVar4[0xe] = -(pcVar1[0xe] == 'i'), auVar4[0xf] = -(pcVar1[0xf] == 'o'),
     auVar5[0] = -(pcVar1[0x10] == 'n'), auVar5[1] = 0xff, auVar5[2] = 0xff, auVar5[3] = 0xff,
     auVar5[4] = 0xff, auVar5[5] = 0xff, auVar5[6] = 0xff, auVar5[7] = 0xff, auVar5[8] = 0xff,
     auVar5[9] = 0xff, auVar5[10] = 0xff, auVar5[0xb] = 0xff, auVar5[0xc] = 0xff, auVar5[0xd] = 0xff
     , auVar5[0xe] = 0xff, auVar5[0xf] = 0xff, auVar5 = auVar5 & auVar4,
     (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff)) {
    pp_Var2 = (_func_int **)operator_new(0x80);
    *pp_Var2 = (_func_int *)&PTR__Command_002576e0;
    pp_Var2[1] = (_func_int *)(pp_Var2 + 3);
    local_30 = (_func_int *)0x11;
    p_Var3 = (_func_int *)std::__cxx11::string::_M_create((ulong *)(pp_Var2 + 1),(ulong)&local_30);
    pp_Var2[1] = p_Var3;
    pp_Var2[3] = local_30;
    *(undefined8 *)p_Var3 = 0x65672d7466697773;
    *(undefined8 *)(p_Var3 + 8) = 0x6f69737265762d74;
    p_Var3[0x10] = (code)0x6e;
    pp_Var2[2] = local_30;
    pp_Var2[1][(long)local_30] = (_func_int)0x0;
    *(undefined1 *)(pp_Var2 + 0xb) = 0;
    *(undefined1 (*) [16])(pp_Var2 + 9) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pp_Var2 + 7) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pp_Var2 + 5) = (undefined1  [16])0x0;
    *pp_Var2 = (_func_int *)&PTR__SwiftGetVersionCommand_00256cd8;
    SVar6 = llbuild::buildsystem::BuildKey::getCustomTaskData(in_RDX);
    pcVar1 = SVar6.Data;
    if (pcVar1 == (char *)0x0) {
      pp_Var2[0xc] = (_func_int *)(pp_Var2 + 0xe);
      pp_Var2[0xd] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var2 + 0xe) = 0;
    }
    else {
      pp_Var2[0xc] = (_func_int *)(pp_Var2 + 0xe);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(pp_Var2 + 0xc),pcVar1,pcVar1 + SVar6.Length);
    }
  }
  else {
    (this->super_Tool)._vptr_Tool = (_func_int **)0x0;
    pp_Var2 = (_func_int **)0x0;
  }
  (this->super_Tool)._vptr_Tool = pp_Var2;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCustomCommand(
      const BuildKey& key) override {
    if (key.getCustomTaskName() == "swift-get-version" ) {
      return llvm::make_unique<SwiftGetVersionCommand>(key);
    }

    return nullptr;
  }